

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O1

bool sptk::WriteStream<std::__cxx11::string>
               (int write_point,int write_size,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *sequence_to_write,ostream *output_stream,int *actual_write_size)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  
  if (output_stream == (ostream *)0x0 || (write_size < 1 || write_point < 0)) {
    bVar6 = false;
  }
  else {
    uVar5 = write_point + write_size;
    bVar6 = false;
    iVar1 = 0;
    if ((ulong)uVar5 <= (ulong)(*(long *)(sequence_to_write + 8) - *(long *)sequence_to_write >> 5))
    {
      if (actual_write_size != (int *)0x0) {
        iVar1 = std::ostream::tellp();
      }
      if (0 < write_size) {
        uVar4 = (ulong)(uint)write_point << 5 | 8;
        do {
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (output_stream,*(char **)(*(long *)sequence_to_write + -8 + uVar4),
                              *(long *)(*(long *)sequence_to_write + uVar4));
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          uVar4 = uVar4 + 0x20;
          write_point = write_point + 1;
        } while (write_point < (int)uVar5);
      }
      if (actual_write_size != (int *)0x0) {
        iVar2 = std::ostream::tellp();
        *actual_write_size = iVar2 - iVar1;
      }
      bVar6 = ((byte)output_stream[*(long *)(*(long *)output_stream + -0x18) + 0x20] & 5) == 0;
    }
  }
  return bVar6;
}

Assistant:

bool WriteStream(int write_point, int write_size,
                 const std::vector<std::string>& sequence_to_write,
                 std::ostream* output_stream, int* actual_write_size) {
  if (write_point < 0 || write_size <= 0 || NULL == output_stream) {
    return false;
  }

  const int end(write_point + write_size);
  if (sequence_to_write.size() < static_cast<std::size_t>(end)) {
    return false;
  }

  const int before((NULL == actual_write_size)
                       ? 0
                       : static_cast<int>(output_stream->tellp()));

  for (int i(write_point); i < end; ++i) {
    *output_stream << sequence_to_write[i] << std::endl;
  }

  if (NULL != actual_write_size) {
    const int after(static_cast<int>(output_stream->tellp()));
    *actual_write_size = after - before;
  }

  return !output_stream->fail();
}